

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizardPrivate::_q_emitCustomButtonClicked(QWizardPrivate *this)

{
  QObject *pQVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  int local_2c;
  void *local_28;
  int *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  lVar2 = QObject::sender();
  lVar3 = 0;
  do {
    if (*(long *)((long)&this->field_20 + lVar3 * 8 + 0x30) == lVar2) {
      local_2c = (int)lVar3 + 6;
      local_20 = &local_2c;
      local_28 = (void *)0x0;
      QMetaObject::activate(pQVar1,&QWizard::staticMetaObject,2,&local_28);
      break;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPrivate::_q_emitCustomButtonClicked()
{
    Q_Q(QWizard);
    QObject *button = q->sender();
    for (int i = QWizard::NStandardButtons; i < QWizard::NButtons; ++i) {
        if (btns[i] == button) {
            emit q->customButtonClicked(QWizard::WizardButton(i));
            break;
        }
    }
}